

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardEffectsObserver.cpp
# Opt level: O1

void __thiscall CardEffectsObserver::update(CardEffectsObserver *this)

{
  pointer pcVar1;
  pointer pCVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pCVar7;
  vector<Cards,_std::allocator<Cards>_> topThree;
  Cards card;
  Cards three;
  Cards two;
  Cards one;
  vector<Cards,_std::allocator<Cards>_> local_228;
  string local_210;
  undefined1 local_1f0 [8];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined8 local_1a8;
  vector<int,_std::allocator<int>_> local_1a0;
  iterator local_188;
  undefined1 local_180 [8];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined8 local_138;
  vector<int,_std::allocator<int>_> local_130;
  iterator local_118;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  iterator local_a8;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> local_50;
  iterator local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n****************************************************************************",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------- CARD EFFECT OBSERVER ----------------------------------",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "****************************************************************************",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  lVar4 = __dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Game::typeinfo,0);
  DeckOfCards::topThreeCards(&local_228,(DeckOfCards *)(lVar4 + 0x60));
  pCVar7 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a0._0_4_ =
       (local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
       _M_start)->id;
  local_98._M_p = (pointer)&local_88;
  pcVar1 = ((local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
             super__Vector_impl_data._M_start)->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,
             pcVar1 + ((local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                        super__Vector_impl_data._M_start)->name)._M_string_length);
  local_78._M_p = (pointer)&local_68;
  pcVar1 = (pCVar7->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (pCVar7->description)._M_string_length);
  local_58._0_4_ = pCVar7->type;
  local_58._4_4_ = pCVar7->energyCost;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,&pCVar7->effect);
  pCVar2 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38._M_current = (pCVar7->it)._M_current;
  local_110._0_4_ =
       local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
       _M_start[1].id;
  local_108._M_p = (pointer)&local_f8;
  pcVar1 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start[1].name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,
             pcVar1 + local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                      super__Vector_impl_data._M_start[1].name._M_string_length);
  local_e8._M_p = (pointer)&local_d8;
  pcVar1 = pCVar2[1].description._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + pCVar2[1].description._M_string_length);
  local_c8._0_4_ = pCVar2[1].type;
  local_c8._4_4_ = pCVar2[1].energyCost;
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,&pCVar2[1].effect);
  pCVar7 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a8._M_current = pCVar2[1].it._M_current;
  local_180._0_4_ =
       local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
       _M_start[2].id;
  local_178._M_p = (pointer)&local_168;
  pcVar1 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
           super__Vector_impl_data._M_start[2].name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar1,
             pcVar1 + local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                      super__Vector_impl_data._M_start[2].name._M_string_length);
  local_158._M_p = (pointer)&local_148;
  pcVar1 = pCVar7[2].description._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar1,pcVar1 + pCVar7[2].description._M_string_length);
  local_138._0_4_ = pCVar7[2].type;
  local_138._4_4_ = pCVar7[2].energyCost;
  std::vector<int,_std::allocator<int>_>::vector(&local_130,&pCVar7[2].effect);
  local_118._M_current = pCVar7[2].it._M_current;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card 1 : ",9);
  poVar5 = operator<<((ostream *)&std::cout,(Cards *)local_a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card 2 : ",9);
  poVar5 = operator<<((ostream *)&std::cout,(Cards *)local_110);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card 3 : ",9);
  poVar5 = operator<<((ostream *)&std::cout,(Cards *)local_180);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pCVar7 = local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_1f0._0_4_ = pCVar7->id;
      local_1e8._M_p = (pointer)&local_1d8;
      pcVar1 = (pCVar7->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar1,pcVar1 + (pCVar7->name)._M_string_length);
      local_1c8._M_p = (pointer)&local_1b8;
      pcVar1 = (pCVar7->description)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar1,pcVar1 + (pCVar7->description)._M_string_length);
      local_1a8._0_4_ = pCVar7->type;
      local_1a8._4_4_ = pCVar7->energyCost;
      std::vector<int,_std::allocator<int>_>::vector(&local_1a0,&pCVar7->effect);
      local_188._M_current = (pCVar7->it)._M_current;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "****************************************************************************",0x4c
                );
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"***********   The potential effect of card",0x2a);
      Cards::getName_abi_cxx11_(&local_210,(Cards *)local_1f0);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_210._M_dataplus._M_p,
                          local_210._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is : **********************",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "****************************************************************************",0x4c
                );
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      iVar3 = Cards::getId((Cards *)local_1f0);
      switch(iVar3) {
      case 0:
        lVar4 = 0x3f;
        pcVar6 = "Player will add 3 victory points IF he rolls more than 2 Ouches";
        break;
      case 1:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
        goto switchD_0011b1c4_caseD_1;
      case 2:
        lVar4 = 0x21;
        pcVar6 = "Player will removed 1 energy cube";
        break;
      case 3:
        lVar4 = 0x19;
        pcVar6 = "Player will take 4 damage";
        break;
      case 9:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Player will add 1 energy cube IF he is in Manhattan",0x33)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        lVar4 = 0x1d;
        std::ostream::flush();
        pcVar6 = "Player will add 2 victory pts";
        break;
      default:
        if (iVar3 == 0x12) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Player will add 1 energy cube IF he is in Brooklyn",0x32
                    );
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
          std::ostream::put(-0x30);
          lVar4 = 0x1d;
          std::ostream::flush();
          pcVar6 = "Player will add 3 victory pts";
          break;
        }
        goto switchD_0011b1c4_caseD_1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
switchD_0011b1c4_caseD_1:
      if (local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != &local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_p != &local_1d8) {
        operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
      }
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != local_228.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
  }
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&local_228);
  return;
}

Assistant:

void CardEffectsObserver::update() {

    cout << "\n****************************************************************************" << endl;

    cout << "-------------------- CARD EFFECT OBSERVER ----------------------------------" << endl;

    cout << "****************************************************************************" << endl;
    const vector<Cards> topThree =  dynamic_cast<Game*>(concreteSubject)->getGameDeck()->topThreeCards();

    Cards one = topThree[0];
    Cards two = topThree[1];
    Cards three = topThree[2];
    cout << "Card 1 : " << one << endl;
    cout << "Card 2 : " << two << endl;
    cout << "Card 3 : " << three << endl;


    for (const auto card: topThree){
        cout << "****************************************************************************" << endl;
        cout << "***********   The potential effect of card" << card.getName() << " is : **********************" << endl;
        cout << "****************************************************************************" << endl;
        switch(card.getId()){
            case 0:
                cout << "Player will add 3 victory points IF he rolls more than 2 Ouches" << endl;
                break;
            case 1:

                break;
            case 2:
                cout << "Player will removed 1 energy cube" << endl;
                break;
            case 3:
                cout << "Player will take 4 damage" << endl;
                break;
            case 4:

                break;
            case 5:

                break;
            case 6:

                break;
            case 7:

                break;
            case 8:

                break;
            case 9:
                cout << "Player will add 1 energy cube IF he is in Manhattan" << endl;
                cout << "Player will add 2 victory pts" << endl;
                break;
            case 18:
                cout << "Player will add 1 energy cube IF he is in Brooklyn" << endl;
                cout << "Player will add 3 victory pts" << endl;
                break;
        }
    }


}